

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O2

void Acb_NtkWindowUndo(Acb_Ntk_t *p,Vec_Int_t *vWin)

{
  int iVar1;
  int iVar2;
  int i;
  
  i = 0;
  while( true ) {
    if (vWin->nSize <= i) {
      return;
    }
    iVar1 = Vec_IntEntry(vWin,i);
    iVar2 = Abc_Lit2Var(iVar1);
    iVar2 = Vec_IntEntry(&p->vObjFunc,iVar2);
    if (iVar2 == -1) break;
    iVar1 = Abc_Lit2Var(iVar1);
    Vec_IntWriteEntry(&p->vObjFunc,iVar1,-1);
    i = i + 1;
  }
  __assert_fail("Vec_IntEntry(&p->vObjFunc, Abc_Lit2Var(iObj)) != -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbMfs.c"
                ,0x11a,"void Acb_NtkWindowUndo(Acb_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Acb_NtkWindowUndo( Acb_Ntk_t * p, Vec_Int_t * vWin )
{
    int i, iObj;
    Vec_IntForEachEntry( vWin, iObj, i )
    {
        assert( Vec_IntEntry(&p->vObjFunc, Abc_Lit2Var(iObj)) != -1 );
        Vec_IntWriteEntry( &p->vObjFunc, Abc_Lit2Var(iObj), -1 );
    }
}